

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateProfiledNewScFloatArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef)

{
  Opnd *pOVar1;
  _func_int **pp_Var2;
  Func *pFVar3;
  code *pcVar4;
  Instr *pIVar5;
  bool bVar6;
  OpndKind OVar7;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  LabelInstr *helperLabel;
  undefined4 *puVar8;
  RegOpnd *baseOpnd;
  AddrOpnd *pAVar9;
  IndirOpnd *pIVar10;
  RegOpnd *pRVar11;
  intptr_t pMemLoc;
  MemRefOpnd *src;
  LabelInstr *target;
  ArrayCallSiteInfo *arrayInfo_00;
  int iVar12;
  int offset;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  AutoReuseOpnd autoReuseDstElementsOpnd;
  uint32 local_4c;
  Func *pFStack_48;
  uint32 size;
  bool local_39;
  Instr *pIStack_38;
  bool isHeadSegmentZeroed;
  
  pIStack_38 = instr;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar6 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ArrayLiteralFastPathPhase,sourceContextId,functionId);
  if (((!bVar6) && (DAT_015b5f99 == '\0')) && (((arrayInfo->field_0).bits & 2) == 0)) {
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase);
    if (bVar6) {
      return;
    }
    pOVar1 = pIStack_38->m_src1;
    OVar7 = IR::Opnd::GetKind(pOVar1);
    if (OVar7 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pFStack_48 = (Func *)__tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)&pFStack_48->m_alloc = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar6) goto LAB_005cbb39;
      *(undefined4 *)&pFStack_48->m_alloc = 0;
    }
    if (*(byte *)((long)&pOVar1[2].m_valueType.field_0.bits + 1) != 0x20) {
      return;
    }
    pFStack_48 = this->m_func;
    helperLabel = IR::LabelInstr::New(Label,pFStack_48,true);
    pIVar5 = pIStack_38;
    GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
              (this,pIStack_38,arrayInfo_00,arrayInfoAddr,helperLabel);
    pOVar1 = pIVar5->m_src1;
    OVar7 = IR::Opnd::GetKind(pOVar1);
    if (OVar7 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar6) goto LAB_005cbb39;
      *puVar8 = 0;
    }
    pp_Var2 = pOVar1[1]._vptr_Opnd;
    local_4c = *(uint32 *)pp_Var2;
    pRVar11 = (RegOpnd *)pIStack_38->m_dst;
    OVar7 = IR::Opnd::GetKind((Opnd *)pRVar11);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) {
LAB_005cbb39:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    baseOpnd = GenerateArrayAllocHelper<Js::JavascriptNativeFloatArray>
                         (this,pIStack_38,&local_4c,arrayInfo,&local_39,false,false);
    local_98 = (undefined1  [8])0x0;
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_98,&baseOpnd->super_Opnd,pFStack_48,true);
    pAVar9 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,false
                               ,(Var)0x0);
    pIVar10 = IR::IndirOpnd::New(pRVar11,0x38,(pAVar9->super_Opnd).m_type,this->m_func,false);
    InsertMove(&pIVar10->super_Opnd,&pAVar9->super_Opnd,pIStack_38,true);
    pFVar3 = pFStack_48;
    pRVar11 = IR::RegOpnd::New(TyUint64,pFStack_48);
    autoReuseHeadOpnd.autoDelete = false;
    autoReuseHeadOpnd.wasInUse = false;
    autoReuseHeadOpnd._18_6_ = 0;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete,&pRVar11->super_Opnd,pFVar3,true);
    pAVar9 = IR::AddrOpnd::New((intptr_t)(pOVar1[2]._vptr_Opnd + 1),AddrOpndKindDynamicMisc,pFVar3,
                               false,(Var)0x0);
    pIVar10 = IR::IndirOpnd::New(baseOpnd,0x18,TyUint64,pFStack_48,false);
    InsertLea(pRVar11,&pIVar10->super_Opnd,pIStack_38);
    GenerateMemCopy(this,&pRVar11->super_Opnd,&pAVar9->super_Opnd,*(int *)pp_Var2 << 3,pIStack_38);
    iVar12 = local_4c - *(int *)pp_Var2;
    if (iVar12 != 0) {
      offset = *(int *)pp_Var2 * 8 + 0x18;
      do {
        pFVar3 = this->m_func;
        pMemLoc = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr(pFVar3->m_threadContextInfo)
        ;
        src = IR::MemRefOpnd::New(pMemLoc,TyFloat64,pFVar3,AddrOpndKindDynamicMisc);
        pIVar10 = IR::IndirOpnd::New(baseOpnd,offset,(src->super_Opnd).m_type,this->m_func,false);
        InsertMove(&pIVar10->super_Opnd,&src->super_Opnd,pIStack_38,true);
        offset = offset + 8;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    target = IR::LabelInstr::New(Label,pFStack_48,false);
    pIVar5 = pIStack_38;
    InsertBranch(Br,false,target,pIStack_38);
    IR::Instr::InsertBefore(pIVar5,&helperLabel->super_Instr);
    IR::Instr::InsertAfter(pIVar5,&target->super_Instr);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
  }
  return;
}

Assistant:

void
Lowerer::GenerateProfiledNewScFloatArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef)
{
    if (PHASE_OFF(Js::ArrayLiteralFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return;
    }

    if (!arrayInfo->IsNativeFloatArray())
    {
        return;
    }

    if (instr->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() != IR::AddrOpndKindDynamicAuxBufferRef)
    {
        return;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    // If the array info hasn't mark as not int array yet, go to the helper and mark it.
    // It really is just for assert purpose in JavascriptNativeFloatArray::ToVarArray
    GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);

    IR::AddrOpnd * elementsOpnd = instr->GetSrc1()->AsAddrOpnd();
    Js::AuxArray<double> * doubles = (Js::AuxArray<double> *)elementsOpnd->m_metadata;
    uint32 size = doubles->count;

    // Generate code as in JavascriptArray::NewLiteral
    bool isHeadSegmentZeroed;
    IR::RegOpnd * dstOpnd = instr->GetDst()->AsRegOpnd();
    Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
    IR::RegOpnd * headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isHeadSegmentZeroed);
    const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

    GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isHeadSegmentZeroed);

    // Initialize the elements

    IR::RegOpnd * dstElementsOpnd = IR::RegOpnd::New(TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseDstElementsOpnd(dstElementsOpnd, func);
    IR::Opnd * srcOpnd = IR::AddrOpnd::New((intptr_t)elementsOpnd->m_address + Js::AuxArray<double>::OffsetOfElements(), IR::AddrOpndKindDynamicMisc, func);
    InsertLea(dstElementsOpnd, IR::IndirOpnd::New(headOpnd, sizeof(Js::SparseArraySegmentBase), TyMachPtr, func), instr);
    GenerateMemCopy(dstElementsOpnd, srcOpnd, doubles->count * sizeof(double), instr);

    // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
    uint const offsetStart = sizeof(Js::SparseArraySegmentBase) + doubles->count * sizeof(double);
    uint const missingItem = (size - doubles->count);
    for (uint i = 0; i < missingItem; i++)
    {
        GenerateMemInit(headOpnd, offsetStart + i * sizeof(double),
            GetMissingItemOpndForAssignment(TyFloat64, m_func), instr, isHeadSegmentZeroed);
    }
    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}